

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_array_union.hh
# Opt level: O0

void avro::codec_traits<uau::_union_array_union_Union__0__>::decode
               (Decoder *d,_union_array_union_Union__0__ *v)

{
  _union_array_union_Union__0__ *this;
  undefined8 uVar1;
  long *in_RDI;
  int32_t vv;
  size_t n;
  string *in_stack_ffffffffffffff88;
  Exception *in_stack_ffffffffffffff90;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  this = (_union_array_union_Union__0__ *)(**(code **)(*in_RDI + 0xb0))();
  if (this < (_union_array_union_Union__0__ *)0x2) {
    if (this == (_union_array_union_Union__0__ *)0x0) {
      (**(code **)(*in_RDI + 0x18))();
      uau::_union_array_union_Union__0__::set_null(this);
    }
    else if (this == (_union_array_union_Union__0__ *)0x1) {
      decode<int>((Decoder *)0x1,(int *)in_stack_ffffffffffffff88);
      uau::_union_array_union_Union__0__::set_int(this,(int32_t *)in_stack_ffffffffffffff88);
    }
    return;
  }
  uVar1 = __cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  Exception::Exception(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void decode(Decoder& d, uau::_union_array_union_Union__0__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            d.decodeNull();
            v.set_null();
            break;
        case 1:
            {
                int32_t vv;
                avro::decode(d, vv);
                v.set_int(vv);
            }
            break;
        }
    }